

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b6a::ConstexprLog2_PowersOfTwo_Test::~ConstexprLog2_PowersOfTwo_Test
          (ConstexprLog2_PowersOfTwo_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConstexprLog2, PowersOfTwo) {
	EXPECT_EQ(detail::log2(   2),  1);
	EXPECT_EQ(detail::log2(   4),  2);
	EXPECT_EQ(detail::log2(   8),  3);
	EXPECT_EQ(detail::log2(  16),  4);
	EXPECT_EQ(detail::log2(  32),  5);
	EXPECT_EQ(detail::log2(  64),  6);
	EXPECT_EQ(detail::log2( 128),  7);
	EXPECT_EQ(detail::log2( 256),  8);
	EXPECT_EQ(detail::log2( 512),  9);
	EXPECT_EQ(detail::log2(1024), 10);
}